

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadixSort.cpp
# Opt level: O1

void srs::radixSort(vector<Graph::Edge,_std::allocator<Graph::Edge>_> *A)

{
  uint64_t *puVar1;
  undefined8 *puVar2;
  value_type *__value;
  pointer pEVar3;
  pointer pEVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  u64 i_1;
  long lVar8;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> *__range2;
  pointer pEVar9;
  Edge *i;
  pointer pEVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  u64 deg;
  long lVar14;
  pointer pEVar15;
  pointer pEVar16;
  array<unsigned_long,_256UL> B;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> local_848;
  long local_830 [256];
  
  __value = (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
            super__Vector_impl_data._M_start;
  std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector
            (&local_848,
             (long)(A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)__value >> 5,__value,
             (allocator_type *)local_830);
  lVar14 = 0;
  pEVar9 = local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar15 = local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar16 = local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  do {
    memset((allocator_type *)local_830,0,0x800);
    pEVar3 = (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pEVar4 = (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pEVar3 != pEVar4) {
      pEVar10 = pEVar3;
      do {
        local_830[pEVar10->shift >> ((char)lVar14 * '\b' & 0x3fU) & 0xff] =
             local_830[pEVar10->shift >> ((char)lVar14 * '\b' & 0x3fU) & 0xff] + 1;
        pEVar10 = pEVar10 + 1;
      } while (pEVar10 != pEVar4);
    }
    lVar8 = 1;
    lVar11 = local_830[0];
    do {
      lVar11 = lVar11 + local_830[lVar8];
      local_830[lVar8] = lVar11;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x100);
    lVar11 = (long)pEVar4 - (long)pEVar3;
    if (lVar11 != 0) {
      lVar8 = lVar11 >> 5;
      lVar11 = lVar11 + -8;
      do {
        pEVar3 = (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = *(ulong *)((long)&(pEVar3->super_LightEdge).u + lVar11) >>
                 ((char)lVar14 * '\b' & 0x3fU) & 0xff;
        lVar13 = local_830[uVar12] + -1;
        local_830[uVar12] = lVar13;
        puVar1 = (uint64_t *)((long)pEVar3 + lVar11 + -0x18);
        uVar5 = *puVar1;
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)pEVar3 + lVar11 + -8);
        uVar7 = puVar2[1];
        lVar11 = lVar11 + -0x20;
        *(undefined8 *)&pEVar15[lVar13].finished = *puVar2;
        *(uint64_t *)(&pEVar15[lVar13].finished + 8) = uVar7;
        pEVar15[lVar13].super_LightEdge.u = uVar5;
        pEVar15[lVar13].super_LightEdge.v = uVar6;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
    super__Vector_impl_data._M_start =
         (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
         super__Vector_impl_data._M_start;
    local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
    super__Vector_impl_data._M_start = pEVar15;
    (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
    super__Vector_impl_data._M_finish = pEVar9;
    (A->super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = pEVar16;
    lVar14 = lVar14 + 1;
    pEVar9 = local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pEVar15 = local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
              super__Vector_impl_data._M_start;
    pEVar16 = local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  } while (lVar14 != 8);
  if (local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_848.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void srs::radixSort(std::vector<Graph::Edge> &A) {
    std::vector<Graph::Edge> R(A.size(), A[0]);
    for (u64 deg = 0; deg < Digits; ++deg) {
        std::array<u64, Variants> B{};

        for (auto &i : A)
            ++B[ind(i.shift, deg)];

        for (u64 i = 1; i < B.size(); ++i)
            B[i] += B[i - 1];

        for (u64 i = A.size(); i--;)
            R[--B[ind(A[i].shift, deg)]] = A[i];
        std::swap(A, R);
    }
}